

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O1

void __thiscall dynamicgraph::Tracer::closeFiles(Tracer *this)

{
  mutex *__mutex;
  uint uVar1;
  int iVar2;
  ExceptionTraces *this_00;
  long *plVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  long *plVar6;
  ErrorCodeEnum EStack_74;
  unique_lock<std::mutex> uStack_70;
  undefined1 *apuStack_60 [2];
  undefined1 auStack_50 [16];
  mutex *pmStack_40;
  
  __mutex = &this->files_mtx;
  uVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar1 == 0) {
    for (p_Var5 = (this->files).
                  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (_List_node_base *)&this->files != p_Var5; p_Var5 = p_Var5->_M_next) {
      if (p_Var5[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var5[1]._M_next)->_M_next + 8))();
      }
    }
    std::__cxx11::
    list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::clear(&this->files);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  plVar3 = (long *)(ulong)uVar1;
  std::__throw_system_error(uVar1);
  if ((char)plVar3[0x38] == '\x01') {
    uStack_70._M_device = (mutex_type *)(plVar3 + 0x1e);
    pmStack_40 = __mutex;
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)uStack_70._M_device);
    uStack_70._M_owns = iVar2 == 0;
    if (uStack_70._M_owns) {
      if (plVar3[0x34] != plVar3[0x1d]) {
        this_00 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
        EStack_74 = NOT_OPEN;
        apuStack_60[0] = auStack_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)apuStack_60,"No files open for tracing","");
        dynamicgraph::ExceptionTraces::ExceptionTraces
                  (this_00,&EStack_74,(string *)apuStack_60," (file=%d != %d=sig).",plVar3[0x34],
                   plVar3[0x1d]);
        __cxa_throw(this_00,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
      }
      plVar6 = plVar3 + 0x32;
      plVar4 = plVar3 + 0x1b;
      while (plVar4 = (long *)*plVar4, plVar3 + 0x1b != plVar4) {
        plVar6 = (long *)*plVar6;
        (**(code **)(*plVar3 + 0x58))(plVar3,plVar6[2],plVar4[2]);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_70);
  }
  return;
}

Assistant:

void Tracer::closeFiles() {
  dgDEBUGIN(15);
  std::lock_guard<std::mutex> files_lock(files_mtx);

  for (FileList::iterator iter = files.begin(); files.end() != iter; ++iter) {
    std::ostream *filePtr = *iter;
    delete filePtr;
  }
  files.clear();

  dgDEBUGOUT(15);
}